

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pod_vector.h
# Opt level: O0

void __thiscall
bk_lib::
pod_vector<Clasp::Asp::RuleTransform::Impl::TodoItem,_std::allocator<Clasp::Asp::RuleTransform::Impl::TodoItem>_>
::append_realloc(pod_vector<Clasp::Asp::RuleTransform::Impl::TodoItem,_std::allocator<Clasp::Asp::RuleTransform::Impl::TodoItem>_>
                 *this,size_type n,TodoItem *x)

{
  pointer __src;
  size_type sVar1;
  size_type sVar2;
  ebo *peVar3;
  TodoItem *in_RDX;
  uint in_ESI;
  pod_vector<Clasp::Asp::RuleTransform::Impl::TodoItem,_std::allocator<Clasp::Asp::RuleTransform::Impl::TodoItem>_>
  *in_RDI;
  pointer temp;
  size_type new_cap;
  void *in_stack_ffffffffffffffb0;
  ebo *peVar4;
  size_type in_stack_ffffffffffffffb8;
  TodoItem *first;
  new_allocator<Clasp::Asp::RuleTransform::Impl::TodoItem> *in_stack_ffffffffffffffc0;
  
  sVar1 = grow_size((pod_vector<Clasp::Asp::RuleTransform::Impl::TodoItem,_std::allocator<Clasp::Asp::RuleTransform::Impl::TodoItem>_>
                     *)in_stack_ffffffffffffffc0,(size_type)(in_stack_ffffffffffffffb8 >> 0x20));
  peVar3 = (ebo *)__gnu_cxx::new_allocator<Clasp::Asp::RuleTransform::Impl::TodoItem>::allocate
                            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                             in_stack_ffffffffffffffb0);
  if ((in_RDI->ebo_).buf != (pointer)0x0) {
    __src = (in_RDI->ebo_).buf;
    peVar4 = peVar3;
    sVar2 = size(in_RDI);
    memcpy(peVar4,__src,(ulong)sVar2 * 0xc);
  }
  sVar2 = size(in_RDI);
  first = (TodoItem *)((long)&peVar3->buf + (ulong)sVar2 * 0xc);
  peVar4 = peVar3;
  sVar2 = size(in_RDI);
  detail::fill<Clasp::Asp::RuleTransform::Impl::TodoItem>
            (first,(TodoItem *)((long)&peVar4->buf + (ulong)in_ESI * 0xc + (ulong)sVar2 * 0xc),
             in_RDX);
  ebo::release(peVar4);
  (in_RDI->ebo_).buf = (pointer)peVar3;
  (in_RDI->ebo_).cap = sVar1;
  (in_RDI->ebo_).size = in_ESI + (in_RDI->ebo_).size;
  return;
}

Assistant:

void append_realloc(size_type n, const T& x) {
		size_type new_cap = grow_size(n);
		pointer temp      = ebo_.allocate(new_cap);
		if (ebo_.buf) {
			std::memcpy(temp, ebo_.buf, size()*sizeof(T));
		}
		detail::fill(temp+size(), temp+size()+n, x);
		ebo_.release();
		ebo_.buf  = temp;
		ebo_.cap  = new_cap;
		ebo_.size+= n;
	}